

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O0

__int128 * __thiscall
calculator::ExpressionParser<__int128>::checkZero(ExpressionParser<__int128> *this,__int128 value)

{
  undefined8 uVar1;
  long in_RDX;
  __int128 *in_RSI;
  allocator<char> *in_RDI;
  ostringstream msg;
  size_t division;
  string divOperators;
  string *in_stack_fffffffffffffd90;
  string *in_stack_fffffffffffffd98;
  error *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  string local_220 [32];
  ostringstream local_200 [376];
  string *local_88;
  allocator<char> local_69;
  undefined1 local_68 [104];
  
  if (in_RSI == (__int128 *)0x0 && in_RDX == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,
               (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),in_RDI);
    std::allocator<char>::~allocator(&local_69);
    local_88 = (string *)std::__cxx11::string::find_last_of((string *)in_RDI,(ulong)local_68);
    std::__cxx11::ostringstream::ostringstream(local_200);
    std::operator<<((ostream *)local_200,"Parser error: division by 0");
    if (local_88 != (string *)0xffffffffffffffff) {
      in_stack_fffffffffffffda0 =
           (error *)std::operator<<((ostream *)local_200," (error token is \"");
      in_stack_fffffffffffffd98 = local_88;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_220,(ulong)in_RDI);
      in_stack_fffffffffffffd90 =
           (string *)std::operator<<((ostream *)in_stack_fffffffffffffda0,local_220);
      std::operator<<((ostream *)in_stack_fffffffffffffd90,"\")");
      std::__cxx11::string::~string(local_220);
    }
    uVar1 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    error::error(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    __cxa_throw(uVar1,&error::typeinfo,error::~error);
  }
  return in_RSI;
}

Assistant:

T checkZero(T value) const
  {
    if (value == 0)
    {
      std::string divOperators("/%");
      std::size_t division = expr_.find_last_of(divOperators, index_ - 2);
      std::ostringstream msg;
      msg << "Parser error: division by 0";
      if (division != std::string::npos)
        msg << " (error token is \""
            << expr_.substr(division, expr_.size() - division)
            << "\")";
      throw calculator::error(expr_, msg.str());
    }
    return value;
  }